

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase132::run(TestCase132 *this)

{
  bool bVar1;
  anon_class_8_1_6b0526df *extraout_RDX;
  anon_class_8_1_6b0526df *extraout_RDX_00;
  anon_class_8_1_6b0526df *func;
  anon_class_8_1_6b0526df *extraout_RDX_01;
  anon_class_8_1_6b0526df *func_00;
  anon_class_8_1_6b0526df *func_01;
  anon_class_8_1_6b0526df *func_02;
  bool local_1f01;
  undefined1 auStack_1f00 [7];
  bool _kj_shouldLog_14;
  Maybe<capnp::EnumSchema::Enumerant> local_1ef0;
  DebugExpression<kj::Maybe<capnp::EnumSchema::Enumerant>_> local_1ea8;
  undefined1 local_1e60 [8];
  DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> _kjCondition_15;
  undefined1 auStack_1df0 [7];
  bool _kj_shouldLog_13;
  Maybe<capnp::EnumSchema::Enumerant> local_1de0;
  DebugExpression<kj::Maybe<capnp::EnumSchema::Enumerant>_> local_1d98;
  undefined1 local_1d50 [8];
  DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> _kjCondition_14;
  undefined1 auStack_1ce0 [7];
  bool _kj_shouldLog_12;
  Maybe<capnp::EnumSchema::Enumerant> local_1cd0;
  DebugExpression<kj::Maybe<capnp::EnumSchema::Enumerant>_> local_1c88;
  undefined1 local_1c40 [8];
  DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> _kjCondition_13;
  undefined1 auStack_1bd0 [7];
  bool _kj_shouldLog_11;
  Maybe<capnp::EnumSchema::Enumerant> local_1bc0;
  DebugExpression<kj::Maybe<capnp::EnumSchema::Enumerant>_> local_1b78;
  undefined1 local_1b30 [8];
  DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> _kjCondition_12;
  undefined1 auStack_1ac0 [7];
  bool _kj_shouldLog_10;
  Maybe<capnp::EnumSchema::Enumerant> local_1ab0;
  DebugExpression<kj::Maybe<capnp::EnumSchema::Enumerant>_> local_1a68;
  undefined1 local_1a20 [8];
  DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> _kjCondition_11;
  undefined1 local_19b0 [7];
  bool _kj_shouldLog_9;
  Enumerant local_1978;
  Enumerant *local_1938;
  undefined1 local_1930 [8];
  DebugComparison<capnp::EnumSchema::Enumerant_&,_capnp::EnumSchema::Enumerant> _kjCondition_10;
  DebugExpression<capnp::EnumSchema::Enumerant_&> DStack_18c8;
  bool _kj_shouldLog_8;
  undefined1 local_18c0 [8];
  DebugComparison<capnp::EnumSchema::Enumerant_&,_capnp::EnumSchema::Enumerant_&> _kjCondition_9;
  undefined1 local_1888 [8];
  Enumerant lookup;
  Schema SStack_1840;
  bool _kj_shouldLog_7;
  EnumSchema local_1838;
  undefined1 local_1830 [8];
  DebugComparison<capnp::EnumSchema,_capnp::EnumSchema_&> _kjCondition_8;
  ArrayPtr<const_char> local_17d8;
  bool local_17c1;
  undefined1 local_17c0 [7];
  bool _kj_shouldLog_6;
  ArrayPtr<const_char> local_1790;
  char (*local_1780) [4];
  undefined1 local_1778 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> _kjCondition_7;
  undefined1 local_1710 [8];
  Enumerant enumerant;
  Reader local_16a0;
  Reader local_1670;
  uint local_163c;
  EnumerantList local_1638;
  uint local_15fc;
  Fault local_15f8;
  Fault f;
  Reader local_15c0;
  Reader local_1590;
  uint local_155c;
  EnumerantList local_1558;
  uint local_1520;
  DebugExpression<unsigned_int> local_151c;
  undefined1 local_1518 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_6;
  Schema SStack_14f0;
  bool _kj_shouldLog_5;
  EnumSchema local_14e8;
  undefined1 local_14e0 [8];
  DebugComparison<capnp::EnumSchema,_capnp::EnumSchema_&> _kjCondition_5;
  undefined1 auStack_14b0 [7];
  bool _kj_shouldLog_4;
  Maybe<kj::Exception> local_14a8;
  DebugExpression<kj::Maybe<kj::Exception>_> local_1310;
  undefined1 local_1178 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_4;
  undefined1 auStack_fb8 [7];
  bool _kj_shouldLog_3;
  Maybe<kj::Exception> local_fb0;
  DebugExpression<kj::Maybe<kj::Exception>_> local_e18;
  undefined1 local_c80 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_3;
  undefined1 auStack_ac0 [7];
  bool _kj_shouldLog_2;
  Maybe<kj::Exception> local_ab8;
  DebugExpression<kj::Maybe<kj::Exception>_> local_920;
  undefined1 local_788 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_2;
  bool _kj_shouldLog_1;
  undefined1 local_5c0 [416];
  DebugExpression<kj::Maybe<kj::Exception>_> local_420;
  undefined1 local_288 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_1;
  uint64_t local_a0;
  uint64_t local_98;
  bool local_89;
  undefined1 local_88 [7];
  bool _kj_shouldLog;
  uint64_t local_58;
  uint64_t local_50;
  DebugExpression<unsigned_long> local_48;
  undefined1 local_40 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  EnumSchema schema;
  TestCase132 *this_local;
  
  _kjCondition._32_8_ = Schema::from<capnp::schemas::TestEnum_9c8e9318b29d9cd3>();
  local_50 = typeId<capnp::schemas::TestEnum_9c8e9318b29d9cd3,11281115850894843091ul>();
  local_48 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_50);
  Schema::getProto((Reader *)local_88,(Schema *)&_kjCondition.result);
  local_58 = capnp::schema::Node::Reader::getId((Reader *)local_88);
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_long> *)local_40,&local_48,&local_58);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  func = extraout_RDX;
  if (!bVar1) {
    local_89 = kj::_::Debug::shouldLog(ERROR);
    func = extraout_RDX_00;
    while (local_89 != false) {
      local_98 = typeId<capnp::schemas::TestEnum_9c8e9318b29d9cd3,11281115850894843091ul>();
      Schema::getProto((Reader *)&_kjCondition_1.result,(Schema *)&_kjCondition.result);
      local_a0 = capnp::schema::Node::Reader::getId((Reader *)&_kjCondition_1.result);
      kj::_::Debug::
      log<char_const(&)[69],kj::_::DebugComparison<unsigned_long,unsigned_long>&,unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x87,ERROR,
                 "\"failed: expected \" \"(typeId<TestEnum>()) == (schema.getProto().getId())\", _kjCondition, typeId<TestEnum>(), schema.getProto().getId()"
                 ,(char (*) [69])
                  "failed: expected (typeId<TestEnum>()) == (schema.getProto().getId())",
                 (DebugComparison<unsigned_long,_unsigned_long> *)local_40,&local_98,&local_a0);
      func = extraout_RDX_01;
      local_89 = false;
    }
  }
  local_5c0._0_8_ = &_kjCondition.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase132::run()::__0>
            ((Maybe<kj::Exception> *)(local_5c0 + 8),(kj *)local_5c0,func);
  kj::_::DebugExpressionStart::operator<<
            (&local_420,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
             (Maybe<kj::Exception> *)(local_5c0 + 8));
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_288,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_420,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_420);
  kj::Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)(local_5c0 + 8));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_288);
  if (!bVar1) {
    _kjCondition_2._435_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._435_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[112],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x89,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getDependency(typeId<TestAllTypes>()); }) != kj::none\", _kjCondition"
                 ,(char (*) [112])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.getDependency(typeId<TestAllTypes>()); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_288);
      _kjCondition_2._435_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_288);
  _auStack_ac0 = &_kjCondition.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase132::run()::__1>
            (&local_ab8,(kj *)auStack_ac0,func_00);
  kj::_::DebugExpressionStart::operator<<
            (&local_920,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_ab8);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_788,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_920,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_920);
  kj::Maybe<kj::Exception>::~Maybe(&local_ab8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_788);
  if (!bVar1) {
    _kjCondition_3._439_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_3._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[108],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x8a,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.getDependency(typeId<TestEnum>()); }) != kj::none\", _kjCondition"
                 ,(char (*) [108])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.getDependency(typeId<TestEnum>()); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_788);
      _kjCondition_3._439_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_788);
  _auStack_fb8 = &_kjCondition.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase132::run()::__2>
            (&local_fb0,(kj *)auStack_fb8,func_01);
  kj::_::DebugExpressionStart::operator<<
            (&local_e18,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_fb0);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_c80,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_e18,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_e18);
  kj::Maybe<kj::Exception>::~Maybe(&local_fb0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c80);
  if (!bVar1) {
    _kjCondition_4._439_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_4._439_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x8c,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.asStruct(); }) != kj::none\", _kjCondition"
                 ,(char (*) [85])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.asStruct(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_c80);
      _kjCondition_4._439_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_c80);
  _auStack_14b0 = &_kjCondition.result;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase132::run()::__3>
            (&local_14a8,(kj *)auStack_14b0,func_02);
  kj::_::DebugExpressionStart::operator<<
            (&local_1310,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_14a8);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1178,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_1310,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_1310);
  kj::Maybe<kj::Exception>::~Maybe(&local_14a8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1178);
  if (!bVar1) {
    _kjCondition_5._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_5._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[88],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x8d,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { schema.asInterface(); }) != kj::none\", _kjCondition"
                 ,(char (*) [88])
                  "failed: expected kj::runCatchingExceptions([&]() { schema.asInterface(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1178);
      _kjCondition_5._39_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1178);
  SStack_14f0.raw = (RawBrandedSchema *)Schema::asEnum((Schema *)&_kjCondition.result);
  local_14e8.super_Schema.raw =
       (Schema)kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (EnumSchema *)&stack0xffffffffffffeb10);
  kj::_::DebugExpression<capnp::EnumSchema>::operator==
            ((DebugComparison<capnp::EnumSchema,_capnp::EnumSchema_&> *)local_14e0,
             (DebugExpression<capnp::EnumSchema> *)&local_14e8,(EnumSchema *)&_kjCondition.result);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_14e0);
  if (!bVar1) {
    _kjCondition_6._31_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_6._31_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[43],kj::_::DebugComparison<capnp::EnumSchema,capnp::EnumSchema&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                 ,0x8e,ERROR,"\"failed: expected \" \"schema.asEnum() == schema\", _kjCondition",
                 (char (*) [43])"failed: expected schema.asEnum() == schema",
                 (DebugComparison<capnp::EnumSchema,_capnp::EnumSchema_&> *)local_14e0);
      _kjCondition_6._31_1_ = 0;
    }
  }
  EnumSchema::getEnumerants(&local_1558,(EnumSchema *)&_kjCondition.result);
  local_1520 = EnumSchema::EnumerantList::size(&local_1558);
  local_151c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1520);
  Schema::getProto((Reader *)&f,(Schema *)&_kjCondition.result);
  capnp::schema::Node::Reader::getEnum(&local_15c0,(Reader *)&f);
  capnp::schema::Node::Enum::Reader::getEnumerants(&local_1590,&local_15c0);
  local_155c = List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader::size(&local_1590);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1518,&local_151c,&local_155c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1518);
  if (bVar1) {
    EnumSchema::getEnumerants
              ((EnumerantList *)&_kjCondition_7.result,(EnumSchema *)&_kjCondition.result);
    EnumSchema::EnumerantList::operator[]
              ((Enumerant *)local_1710,(EnumerantList *)&_kjCondition_7.result,0);
    local_1780 = (char (*) [4])
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
    EnumSchema::Enumerant::getProto((Reader *)local_17c0,(Enumerant *)local_1710);
    local_1790 = (ArrayPtr<const_char>)
                 capnp::schema::Enumerant::Reader::getName((Reader *)local_17c0);
    kj::_::DebugExpression<char_const(&)[4]>::operator==
              ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_1778,
               (DebugExpression<char_const(&)[4]> *)&local_1780,(Reader *)&local_1790);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1778);
    if (!bVar1) {
      local_17c1 = kj::_::Debug::shouldLog(ERROR);
      while (local_17c1 != false) {
        EnumSchema::Enumerant::getProto((Reader *)&_kjCondition_8.result,(Enumerant *)local_1710);
        local_17d8 = (ArrayPtr<const_char>)
                     capnp::schema::Enumerant::Reader::getName((Reader *)&_kjCondition_8.result);
        kj::_::Debug::
        log<char_const(&)[61],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                   ,0x93,ERROR,
                   "\"failed: expected \" \"(\\\"foo\\\") == (enumerant.getProto().getName())\", _kjCondition, \"foo\", enumerant.getProto().getName()"
                   ,(char (*) [61])"failed: expected (\"foo\") == (enumerant.getProto().getName())",
                   (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_1778,
                   (char (*) [4])"foo",(Reader *)&local_17d8);
        local_17c1 = false;
      }
    }
    SStack_1840.raw =
         (RawBrandedSchema *)EnumSchema::Enumerant::getContainingEnum((Enumerant *)local_1710);
    local_1838.super_Schema.raw =
         (Schema)kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                            (EnumSchema *)&stack0xffffffffffffe7c0);
    kj::_::DebugExpression<capnp::EnumSchema>::operator==
              ((DebugComparison<capnp::EnumSchema,_capnp::EnumSchema_&> *)local_1830,
               (DebugExpression<capnp::EnumSchema> *)&local_1838,(EnumSchema *)&_kjCondition.result)
    ;
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1830);
    if (!bVar1) {
      lookup.proto._reader._47_1_ = kj::_::Debug::shouldLog(ERROR);
      while (lookup.proto._reader._47_1_ != '\0') {
        kj::_::Debug::
        log<char_const(&)[57],kj::_::DebugComparison<capnp::EnumSchema,capnp::EnumSchema&>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                   ,0x94,ERROR,
                   "\"failed: expected \" \"enumerant.getContainingEnum() == schema\", _kjCondition"
                   ,(char (*) [57])"failed: expected enumerant.getContainingEnum() == schema",
                   (DebugComparison<capnp::EnumSchema,_capnp::EnumSchema_&> *)local_1830);
        lookup.proto._reader._47_1_ = 0;
      }
    }
    kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_9.result,"foo");
    EnumSchema::getEnumerantByName
              ((Enumerant *)local_1888,(EnumSchema *)&_kjCondition.result,
               (StringPtr)stack0xffffffffffffe768);
    DStack_18c8 = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Enumerant *)local_1888);
    kj::_::DebugExpression<capnp::EnumSchema::Enumerant&>::operator==
              ((DebugComparison<capnp::EnumSchema::Enumerant_&,_capnp::EnumSchema::Enumerant_&> *)
               local_18c0,(DebugExpression<capnp::EnumSchema::Enumerant&> *)&stack0xffffffffffffe738
               ,(Enumerant *)local_1710);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_18c0);
    if (!bVar1) {
      _kjCondition_10._95_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_10._95_1_ != '\0') {
        kj::_::Debug::
        log<char_const(&)[37],kj::_::DebugComparison<capnp::EnumSchema::Enumerant&,capnp::EnumSchema::Enumerant&>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                   ,0x97,ERROR,"\"failed: expected \" \"lookup == enumerant\", _kjCondition",
                   (char (*) [37])"failed: expected lookup == enumerant",
                   (DebugComparison<capnp::EnumSchema::Enumerant_&,_capnp::EnumSchema::Enumerant_&>
                    *)local_18c0);
        _kjCondition_10._95_1_ = 0;
      }
    }
    local_1938 = (Enumerant *)
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Enumerant *)local_1888);
    EnumSchema::getEnumerants((EnumerantList *)local_19b0,(EnumSchema *)&_kjCondition.result);
    EnumSchema::EnumerantList::operator[](&local_1978,(EnumerantList *)local_19b0,1);
    kj::_::DebugExpression<capnp::EnumSchema::Enumerant&>::operator!=
              ((DebugComparison<capnp::EnumSchema::Enumerant_&,_capnp::EnumSchema::Enumerant> *)
               local_1930,(DebugExpression<capnp::EnumSchema::Enumerant&> *)&local_1938,&local_1978)
    ;
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1930);
    if (!bVar1) {
      _kjCondition_11._103_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_11._103_1_ != '\0') {
        kj::_::Debug::
        log<char_const(&)[53],kj::_::DebugComparison<capnp::EnumSchema::Enumerant&,capnp::EnumSchema::Enumerant>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                   ,0x98,ERROR,
                   "\"failed: expected \" \"lookup != schema.getEnumerants()[1]\", _kjCondition",
                   (char (*) [53])"failed: expected lookup != schema.getEnumerants()[1]",
                   (DebugComparison<capnp::EnumSchema::Enumerant_&,_capnp::EnumSchema::Enumerant> *)
                   local_1930);
        _kjCondition_11._103_1_ = 0;
      }
    }
    kj::StringPtr::StringPtr((StringPtr *)auStack_1ac0,"noSuchEnumerant");
    EnumSchema::findEnumerantByName
              (&local_1ab0,(EnumSchema *)&_kjCondition.result,(StringPtr)_auStack_1ac0);
    kj::_::DebugExpressionStart::operator<<
              (&local_1a68,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1ab0);
    kj::_::DebugExpression<kj::Maybe<capnp::EnumSchema::Enumerant>>::operator==
              ((DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> *)
               local_1a20,(DebugExpression<kj::Maybe<capnp::EnumSchema::Enumerant>> *)&local_1a68,
               (None *)&kj::none);
    kj::_::DebugExpression<kj::Maybe<capnp::EnumSchema::Enumerant>_>::~DebugExpression(&local_1a68);
    kj::Maybe<capnp::EnumSchema::Enumerant>::~Maybe(&local_1ab0);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a20);
    if (!bVar1) {
      _kjCondition_12._103_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_12._103_1_ != '\0') {
        kj::_::Debug::
        log<char_const(&)[75],kj::_::DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,kj::None_const&>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                   ,0x9a,ERROR,
                   "\"failed: expected \" \"schema.findEnumerantByName(\\\"noSuchEnumerant\\\") == kj::none\", _kjCondition"
                   ,(char (*) [75])
                    "failed: expected schema.findEnumerantByName(\"noSuchEnumerant\") == kj::none",
                   (DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> *)
                   local_1a20);
        _kjCondition_12._103_1_ = 0;
      }
    }
    kj::_::DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&>::
    ~DebugComparison((DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> *)
                     local_1a20);
    kj::StringPtr::StringPtr((StringPtr *)auStack_1bd0,"bar");
    EnumSchema::findEnumerantByName
              (&local_1bc0,(EnumSchema *)&_kjCondition.result,(StringPtr)_auStack_1bd0);
    kj::_::DebugExpressionStart::operator<<
              (&local_1b78,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1bc0);
    kj::_::DebugExpression<kj::Maybe<capnp::EnumSchema::Enumerant>>::operator!=
              ((DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> *)
               local_1b30,(DebugExpression<kj::Maybe<capnp::EnumSchema::Enumerant>> *)&local_1b78,
               (None *)&kj::none);
    kj::_::DebugExpression<kj::Maybe<capnp::EnumSchema::Enumerant>_>::~DebugExpression(&local_1b78);
    kj::Maybe<capnp::EnumSchema::Enumerant>::~Maybe(&local_1bc0);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1b30);
    if (!bVar1) {
      _kjCondition_13._103_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_13._103_1_ != '\0') {
        kj::_::Debug::
        log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,kj::None_const&>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                   ,0x9c,ERROR,
                   "\"failed: expected \" \"schema.findEnumerantByName(\\\"bar\\\") != kj::none\", _kjCondition"
                   ,(char (*) [63])
                    "failed: expected schema.findEnumerantByName(\"bar\") != kj::none",
                   (DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> *)
                   local_1b30);
        _kjCondition_13._103_1_ = 0;
      }
    }
    kj::_::DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&>::
    ~DebugComparison((DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> *)
                     local_1b30);
    kj::StringPtr::StringPtr((StringPtr *)auStack_1ce0,"qux");
    EnumSchema::findEnumerantByName
              (&local_1cd0,(EnumSchema *)&_kjCondition.result,(StringPtr)_auStack_1ce0);
    kj::_::DebugExpressionStart::operator<<
              (&local_1c88,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1cd0);
    kj::_::DebugExpression<kj::Maybe<capnp::EnumSchema::Enumerant>>::operator!=
              ((DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> *)
               local_1c40,(DebugExpression<kj::Maybe<capnp::EnumSchema::Enumerant>> *)&local_1c88,
               (None *)&kj::none);
    kj::_::DebugExpression<kj::Maybe<capnp::EnumSchema::Enumerant>_>::~DebugExpression(&local_1c88);
    kj::Maybe<capnp::EnumSchema::Enumerant>::~Maybe(&local_1cd0);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1c40);
    if (!bVar1) {
      _kjCondition_14._103_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_14._103_1_ != '\0') {
        kj::_::Debug::
        log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,kj::None_const&>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                   ,0x9d,ERROR,
                   "\"failed: expected \" \"schema.findEnumerantByName(\\\"qux\\\") != kj::none\", _kjCondition"
                   ,(char (*) [63])
                    "failed: expected schema.findEnumerantByName(\"qux\") != kj::none",
                   (DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> *)
                   local_1c40);
        _kjCondition_14._103_1_ = 0;
      }
    }
    kj::_::DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&>::
    ~DebugComparison((DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> *)
                     local_1c40);
    kj::StringPtr::StringPtr((StringPtr *)auStack_1df0,"corge");
    EnumSchema::findEnumerantByName
              (&local_1de0,(EnumSchema *)&_kjCondition.result,(StringPtr)_auStack_1df0);
    kj::_::DebugExpressionStart::operator<<
              (&local_1d98,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1de0);
    kj::_::DebugExpression<kj::Maybe<capnp::EnumSchema::Enumerant>>::operator!=
              ((DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> *)
               local_1d50,(DebugExpression<kj::Maybe<capnp::EnumSchema::Enumerant>> *)&local_1d98,
               (None *)&kj::none);
    kj::_::DebugExpression<kj::Maybe<capnp::EnumSchema::Enumerant>_>::~DebugExpression(&local_1d98);
    kj::Maybe<capnp::EnumSchema::Enumerant>::~Maybe(&local_1de0);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1d50);
    if (!bVar1) {
      _kjCondition_15._103_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_15._103_1_ != '\0') {
        kj::_::Debug::
        log<char_const(&)[65],kj::_::DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,kj::None_const&>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                   ,0x9e,ERROR,
                   "\"failed: expected \" \"schema.findEnumerantByName(\\\"corge\\\") != kj::none\", _kjCondition"
                   ,(char (*) [65])
                    "failed: expected schema.findEnumerantByName(\"corge\") != kj::none",
                   (DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> *)
                   local_1d50);
        _kjCondition_15._103_1_ = 0;
      }
    }
    kj::_::DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&>::
    ~DebugComparison((DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> *)
                     local_1d50);
    kj::StringPtr::StringPtr((StringPtr *)auStack_1f00,"grault");
    EnumSchema::findEnumerantByName
              (&local_1ef0,(EnumSchema *)&_kjCondition.result,(StringPtr)_auStack_1f00);
    kj::_::DebugExpressionStart::operator<<
              (&local_1ea8,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1ef0);
    kj::_::DebugExpression<kj::Maybe<capnp::EnumSchema::Enumerant>>::operator!=
              ((DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> *)
               local_1e60,(DebugExpression<kj::Maybe<capnp::EnumSchema::Enumerant>> *)&local_1ea8,
               (None *)&kj::none);
    kj::_::DebugExpression<kj::Maybe<capnp::EnumSchema::Enumerant>_>::~DebugExpression(&local_1ea8);
    kj::Maybe<capnp::EnumSchema::Enumerant>::~Maybe(&local_1ef0);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e60);
    if (!bVar1) {
      local_1f01 = kj::_::Debug::shouldLog(ERROR);
      while (local_1f01 != false) {
        kj::_::Debug::
        log<char_const(&)[66],kj::_::DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,kj::None_const&>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
                   ,0x9f,ERROR,
                   "\"failed: expected \" \"schema.findEnumerantByName(\\\"grault\\\") != kj::none\", _kjCondition"
                   ,(char (*) [66])
                    "failed: expected schema.findEnumerantByName(\"grault\") != kj::none",
                   (DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> *)
                   local_1e60);
        local_1f01 = false;
      }
    }
    kj::_::DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&>::
    ~DebugComparison((DebugComparison<kj::Maybe<capnp::EnumSchema::Enumerant>,_const_kj::None_&> *)
                     local_1e60);
    return;
  }
  EnumSchema::getEnumerants(&local_1638,(EnumSchema *)&_kjCondition.result);
  local_15fc = EnumSchema::EnumerantList::size(&local_1638);
  Schema::getProto((Reader *)&enumerant.proto._reader.nestingLimit,(Schema *)&_kjCondition.result);
  capnp::schema::Node::Reader::getEnum(&local_16a0,(Reader *)&enumerant.proto._reader.nestingLimit);
  capnp::schema::Node::Enum::Reader::getEnumerants(&local_1670,&local_16a0);
  local_163c = List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader::size(&local_1670);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
            (&local_15f8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-test.c++"
             ,0x91,FAILED,
             "(schema.getEnumerants().size()) == (schema.getProto().getEnum().getEnumerants().size())"
             ,
             "_kjCondition,schema.getEnumerants().size(), schema.getProto().getEnum().getEnumerants().size()"
             ,(DebugComparison<unsigned_int,_unsigned_int> *)local_1518,&local_15fc,&local_163c);
  kj::_::Debug::Fault::fatal(&local_15f8);
}

Assistant:

TEST(Schema, Enums) {
  EnumSchema schema = Schema::from<TestEnum>();

  EXPECT_EQ(typeId<TestEnum>(), schema.getProto().getId());

  EXPECT_NONFATAL_FAILURE(schema.getDependency(typeId<TestAllTypes>()));
  EXPECT_NONFATAL_FAILURE(schema.getDependency(typeId<TestEnum>()));

  EXPECT_NONFATAL_FAILURE(schema.asStruct());
  EXPECT_NONFATAL_FAILURE(schema.asInterface());
  EXPECT_TRUE(schema.asEnum() == schema);

  ASSERT_EQ(schema.getEnumerants().size(),
            schema.getProto().getEnum().getEnumerants().size());
  EnumSchema::Enumerant enumerant = schema.getEnumerants()[0];
  EXPECT_EQ("foo", enumerant.getProto().getName());
  EXPECT_TRUE(enumerant.getContainingEnum() == schema);

  EnumSchema::Enumerant lookup = schema.getEnumerantByName("foo");
  EXPECT_TRUE(lookup == enumerant);
  EXPECT_TRUE(lookup != schema.getEnumerants()[1]);

  EXPECT_TRUE(schema.findEnumerantByName("noSuchEnumerant") == kj::none);

  EXPECT_TRUE(schema.findEnumerantByName("bar") != kj::none);
  EXPECT_TRUE(schema.findEnumerantByName("qux") != kj::none);
  EXPECT_TRUE(schema.findEnumerantByName("corge") != kj::none);
  EXPECT_TRUE(schema.findEnumerantByName("grault") != kj::none);
}